

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaAllocator_T::FreeDedicatedMemory(VmaAllocator_T *this,VmaAllocation allocation)

{
  uint32_t uVar1;
  VmaPool this_00;
  VmaAllocation hAlloc;
  VmaAllocator_T *in_RSI;
  VmaAllocator_T *in_RDI;
  VkDeviceMemory hMemory;
  VmaPool parentPool;
  uint32_t memTypeIndex;
  VmaCurrentBudgetData *allocationSize;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  VmaAllocation in_stack_ffffffffffffffd8;
  
  uVar1 = VmaAllocation_T::GetMemoryTypeIndex((VmaAllocation_T *)in_RSI);
  this_00 = VmaAllocation_T::GetParentPool
                      ((VmaAllocation_T *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (this_00 == (VmaPool)0x0) {
    VmaDedicatedAllocationList::Unregister
              ((VmaDedicatedAllocationList *)0x0,in_stack_ffffffffffffffd8);
  }
  else {
    VmaDedicatedAllocationList::Unregister
              ((VmaDedicatedAllocationList *)this_00,in_stack_ffffffffffffffd8);
  }
  hAlloc = (VmaAllocation)
           VmaAllocation_T::GetMemory
                     ((VmaAllocation_T *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  VmaAllocation_T::GetSize((VmaAllocation_T *)in_RSI);
  FreeVulkanMemory(in_RSI,uVar1,(VkDeviceSize)this_00,(VkDeviceMemory)hAlloc);
  allocationSize = &in_RDI->m_Budget;
  uVar1 = VmaAllocation_T::GetMemoryTypeIndex((VmaAllocation_T *)in_RSI);
  uVar1 = MemoryTypeIndexToHeapIndex(in_RDI,uVar1);
  VmaAllocation_T::GetSize((VmaAllocation_T *)in_RSI);
  VmaCurrentBudgetData::RemoveAllocation
            ((VmaCurrentBudgetData *)in_RDI,uVar1,(VkDeviceSize)allocationSize);
  VmaAllocationObjectAllocator::Free((VmaAllocationObjectAllocator *)this_00,hAlloc);
  return;
}

Assistant:

void VmaAllocator_T::FreeDedicatedMemory(const VmaAllocation allocation)
{
    VMA_ASSERT(allocation && allocation->GetType() == VmaAllocation_T::ALLOCATION_TYPE_DEDICATED);

    const uint32_t memTypeIndex = allocation->GetMemoryTypeIndex();
    VmaPool parentPool = allocation->GetParentPool();
    if(parentPool == VK_NULL_HANDLE)
    {
        // Default pool
        m_DedicatedAllocations[memTypeIndex].Unregister(allocation);
    }
    else
    {
        // Custom pool
        parentPool->m_DedicatedAllocations.Unregister(allocation);
    }

    VkDeviceMemory hMemory = allocation->GetMemory();

    /*
    There is no need to call this, because Vulkan spec allows to skip vkUnmapMemory
    before vkFreeMemory.

    if(allocation->GetMappedData() != VMA_NULL)
    {
        (*m_VulkanFunctions.vkUnmapMemory)(m_hDevice, hMemory);
    }
    */

    FreeVulkanMemory(memTypeIndex, allocation->GetSize(), hMemory);

    m_Budget.RemoveAllocation(MemoryTypeIndexToHeapIndex(allocation->GetMemoryTypeIndex()), allocation->GetSize());
    m_AllocationObjectAllocator.Free(allocation);

    VMA_DEBUG_LOG("    Freed DedicatedMemory MemoryTypeIndex=%u", memTypeIndex);
}